

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O1

Integer pnga_pgroup_create(Integer *list,Integer count)

{
  proc_list_t *ppVar1;
  int iVar2;
  int *piVar3;
  bool bVar4;
  Integer IVar5;
  void *__ptr;
  int *pid_list;
  int *piVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  
  IVar5 = GAnproc;
  __ptr = malloc(GAnproc * 8);
  pid_list = (int *)malloc(IVar5 << 2);
  piVar6 = &PGRP_LIST->actv;
  uVar7 = 0xffffffffffffffff;
  do {
    iVar2 = *piVar6;
    uVar10 = uVar7 + 1;
    if (iVar2 == 0) break;
    lVar8 = uVar7 + 2;
    piVar6 = piVar6 + 10;
    uVar7 = uVar10;
  } while (lVar8 < _max_global_array);
  if (iVar2 != 0) {
    pnga_error(" Too many process groups ",(long)_max_global_array);
  }
  IVar5 = GAnproc;
  uVar10 = -(ulong)(iVar2 != 0) | uVar10;
  if (0 < count) {
    lVar8 = 0;
    do {
      lVar9 = list[lVar8];
      if ((lVar9 < 0) || (IVar5 <= lVar9)) {
        pnga_error(" invalid element in list ",lVar9);
      }
      lVar9 = lVar8 + 1;
      for (lVar11 = lVar9; lVar11 < count; lVar11 = lVar11 + 1) {
        if (list[lVar8] == list[lVar11]) {
          pnga_error(" Duplicate elements in list ",list[lVar8]);
        }
      }
      lVar8 = lVar9;
    } while (lVar9 != count);
  }
  IVar5 = GAnproc;
  piVar6 = (int *)malloc(GAnproc * 8);
  PGRP_LIST[uVar10].map_proc_list = piVar6;
  PGRP_LIST[uVar10].inv_map_proc_list = PGRP_LIST[uVar10].map_proc_list + IVar5;
  if (0 < IVar5) {
    memset(PGRP_LIST[uVar10].map_proc_list,0xff,IVar5 * 4);
    memset(PGRP_LIST[uVar10].inv_map_proc_list,0xff,IVar5 * 4);
  }
  if (0 < count) {
    lVar8 = 0;
    do {
      pid_list[lVar8] = (int)list[lVar8];
      lVar8 = lVar8 + 1;
    } while (count != lVar8);
  }
  if (1 < count) {
    lVar8 = 1;
    do {
      iVar2 = pid_list[lVar8];
      lVar9 = lVar8;
      do {
        if (pid_list[lVar9 + -1] <= iVar2) goto LAB_001619c8;
        pid_list[lVar9] = pid_list[lVar9 + -1];
        bVar4 = 1 < lVar9;
        lVar9 = lVar9 + -1;
      } while (bVar4);
      lVar9 = 0;
LAB_001619c8:
      pid_list[lVar9] = iVar2;
      lVar8 = lVar8 + 1;
    } while (lVar8 != count);
  }
  if ((long)GA_Default_Proc_Group == -1) {
    if (0 < count) {
      lVar8 = 0;
      do {
        *(long *)((long)__ptr + lVar8 * 8) = (long)pid_list[lVar8];
        lVar8 = lVar8 + 1;
      } while (count != lVar8);
    }
  }
  else if (0 < count) {
    piVar6 = PGRP_LIST[GA_Default_Proc_Group].inv_map_proc_list;
    lVar8 = 0;
    do {
      *(long *)((long)__ptr + lVar8 * 8) = (long)piVar6[pid_list[lVar8]];
      lVar8 = lVar8 + 1;
    } while (count != lVar8);
  }
  if (0 < count) {
    piVar6 = PGRP_LIST[uVar10].map_proc_list;
    piVar3 = PGRP_LIST[uVar10].inv_map_proc_list;
    lVar8 = 0;
    do {
      lVar9 = *(long *)((long)__ptr + lVar8 * 8);
      piVar6[lVar9] = (int)lVar8;
      piVar3[lVar8] = (int)lVar9;
      lVar8 = lVar8 + 1;
    } while (count != lVar8);
  }
  ppVar1 = PGRP_LIST + uVar10;
  ppVar1->actv = 1;
  ppVar1->parent = GA_Default_Proc_Group;
  ppVar1->mirrored = 0;
  ppVar1->map_nproc = (int)count;
  ARMCI_Group_create((int)count,pid_list,&ppVar1->group);
  free(__ptr);
  free(pid_list);
  return uVar10;
}

Assistant:

Integer pnga_pgroup_create(Integer *list, Integer count)
{
    Integer pgrp_handle, i, j, nprocs, itmp;
    Integer parent;
    int tmp_count;
    Integer *tmp_list;
    int *tmp2_list;
#ifdef MSG_COMMS_MPI
    ARMCI_Group *tmpgrp;
#endif
 

    /* Allocate temporary arrays */
    tmp_list = (Integer*)malloc(GAnproc*sizeof(Integer));
    tmp2_list = (int*)malloc(GAnproc*sizeof(int));

    /*** Get next free process group handle ***/
    pgrp_handle =-1; i=0;
    do{
       if(!PGRP_LIST[i].actv) pgrp_handle=i;
       i++;
    }while(i<_max_global_array && pgrp_handle==-1);
    if( pgrp_handle == -1)
       pnga_error(" Too many process groups ", (Integer)_max_global_array);
 
    /* Check list for validity (no duplicates and no out of range entries) */
    nprocs = GAnproc;
    for (i=0; i<count; i++) {
       if (list[i] <0 || list[i] >= nprocs)
	  pnga_error(" invalid element in list ", list[i]);
       for (j=i+1; j<count; j++) {
	  if (list[i] == list[j])
	     pnga_error(" Duplicate elements in list ", list[i]);
       }
    }
 
    /* Allocate memory for arrays containg processor maps and initialize
       values */
    PGRP_LIST[pgrp_handle].map_proc_list
       = (int*)malloc(GAnproc*sizeof(int)*2);
    PGRP_LIST[pgrp_handle].inv_map_proc_list
       = PGRP_LIST[pgrp_handle].map_proc_list + GAnproc;
    for (i=0; i<GAnproc; i++)
       PGRP_LIST[pgrp_handle].map_proc_list[i] = -1;
    for (i=0; i<GAnproc; i++)
       PGRP_LIST[pgrp_handle].inv_map_proc_list[i] = -1;
    
    for (i=0; i<count; i++) {
       tmp2_list[i] = (int)list[i];
    }
    
    /* use a simple sort routine to reorder list into assending order */
    for (j=1; j<count; j++) {
       itmp = tmp2_list[j];
       i = j-1;
       while(i>=0  && tmp2_list[i] > itmp) {
          tmp2_list[i+1] = tmp2_list[i];
          i--;
       }
       tmp2_list[i+1] = itmp;
    }
    
    /* Remap elements in list to absolute processor indices (if necessary)*/
    if (GA_Default_Proc_Group != -1) {
       parent = GA_Default_Proc_Group;
       for (i=0; i<count; i++) {
          tmp_list[i] = (int)PGRP_LIST[parent].inv_map_proc_list[tmp2_list[i]];
       }
    } else {
       for (i=0; i<count; i++) {
          tmp_list[i] = (int)tmp2_list[i];
       }
    }
    
    tmp_count = (int)(count);
    /* Create proc list maps */
    for (i=0; i<count; i++) {
       j = tmp_list[i];
       PGRP_LIST[pgrp_handle].map_proc_list[j] = i;
       PGRP_LIST[pgrp_handle].inv_map_proc_list[i] = j;
    }
    PGRP_LIST[pgrp_handle].actv = 1;
    PGRP_LIST[pgrp_handle].parent = GA_Default_Proc_Group;
    PGRP_LIST[pgrp_handle].mirrored = 0;
    PGRP_LIST[pgrp_handle].map_nproc = tmp_count;
#ifdef MSG_COMMS_MPI
    tmpgrp = &PGRP_LIST[pgrp_handle].group;
#if ENABLE_CHECKPOINT
    if(ga_group_is_for_ft)
       tmpgrp = ARMCI_Get_ft_group();
    else
#endif
       ARMCI_Group_create(tmp_count, tmp2_list, &PGRP_LIST[pgrp_handle].group);
#endif

    /* Clean up temporary arrays */
    free(tmp_list);
    free(tmp2_list);

#ifdef MSG_COMMS_MPI
    return pgrp_handle;
#else
    return pnga_pgroup_get_default();
#endif
}